

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.h
# Opt level: O2

shared_ptr<chrono::fea::ChNodeFEAbase> __thiscall
chrono::fea::ChElementShellBST::GetNodeN(ChElementShellBST *this,int n)

{
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar1;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)*(int *)(CONCAT44(in_register_00000034,n) + 0x5c + (long)in_EDX * 4) * 0x10 +
             *(long *)(CONCAT44(in_register_00000034,n) + 0x78)));
  sVar1.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAbase>)
         sVar1.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChNodeFEAbase> GetNodeN(int n) override { return m_nodes[nodes_used_to_six[n]]; }